

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmArgumentParser.h
# Opt level: O1

void __thiscall
cmArgumentParser<void>::
Parse<std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>
          (cmArgumentParser<void> *this,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *args,vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *unparsedArguments,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *keywordsMissingValue)

{
  pointer pbVar1;
  pointer pbVar2;
  string_view arg;
  Instance instance;
  Instance local_48;
  
  local_48.CurrentString = (string *)0x0;
  local_48.CurrentList = (StringList *)0x0;
  local_48.ExpectValue = false;
  pbVar1 = (args->
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           )._M_impl.super__Vector_impl_data._M_finish;
  pbVar2 = (args->
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           )._M_impl.super__Vector_impl_data._M_start;
  local_48.Bindings = &this->Bindings;
  for (; pbVar2 != pbVar1; pbVar2 = pbVar2 + 1) {
    arg._M_str = (pbVar2->_M_dataplus)._M_p;
    arg._M_len = pbVar2->_M_string_length;
    ArgumentParser::Instance::Consume
              (&local_48,arg,(void *)0x0,unparsedArguments,keywordsMissingValue);
  }
  return;
}

Assistant:

Instance(ActionMap const& bindings)
    : Bindings(bindings)
  {
  }